

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bundle_adjustment.cc
# Opt level: O0

void __thiscall
sfm::ba::BundleAdjustment::update_camera
          (BundleAdjustment *this,Camera *cam,double *update,Camera *out)

{
  double local_c8;
  double rot_update [9];
  double local_78;
  double rot_orig [9];
  int offset;
  Camera *out_local;
  double *update_local;
  Camera *cam_local;
  BundleAdjustment *this_local;
  
  if (((this->opts).fixed_intrinsics & 1U) == 0) {
    out->focal_length = cam->focal_length + *update;
    out->distortion[0] = cam->distortion[0] + update[1];
    out->distortion[1] = cam->distortion[1] + update[2];
  }
  else {
    out->focal_length = cam->focal_length;
    out->distortion[0] = cam->distortion[0];
    out->distortion[1] = cam->distortion[1];
  }
  rot_orig[8]._4_4_ = 3;
  if (((this->opts).fixed_intrinsics & 1U) != 0) {
    rot_orig[8]._4_4_ = 0;
  }
  out->translation[0] = cam->translation[0] + update[rot_orig[8]._4_4_];
  out->translation[1] = cam->translation[1] + update[rot_orig[8]._4_4_ + 1];
  out->translation[2] = cam->translation[2] + update[rot_orig[8]._4_4_ + 2];
  std::copy<double_const*,double*>(cam->rotation,(double *)&cam->is_constant,&local_78);
  rodrigues_to_matrix(this,update + (long)rot_orig[8]._4_4_ + 3,&local_c8);
  math::matrix_multiply<double>(&local_c8,3,3,&local_78,3,out->rotation);
  return;
}

Assistant:

void
BundleAdjustment::update_camera (Camera const& cam,
    double const* update, Camera* out)
{
    if (opts.fixed_intrinsics)
    {
        out->focal_length = cam.focal_length;
        out->distortion[0] = cam.distortion[0];
        out->distortion[1] = cam.distortion[1];
    }
    else
    {
        out->focal_length = cam.focal_length + update[0];
        out->distortion[0] = cam.distortion[0] + update[1];
        out->distortion[1] = cam.distortion[1] + update[2];
    }

    int const offset = this->opts.fixed_intrinsics ? 0 : 3;
    out->translation[0] = cam.translation[0] + update[0 + offset];
    out->translation[1] = cam.translation[1] + update[1 + offset];
    out->translation[2] = cam.translation[2] + update[2 + offset];

    double rot_orig[9];
    std::copy(cam.rotation, cam.rotation + 9, rot_orig);
    double rot_update[9];
    this->rodrigues_to_matrix(update + 3 + offset, rot_update);
    math::matrix_multiply(rot_update, 3, 3, rot_orig, 3, out->rotation);
}